

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

SUNErrCode SUNQRAdd_MGS(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  long lVar1;
  sunrealtype sVar2;
  double dVar3;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    lVar1 = 0;
    do {
      sVar2 = N_VDotProd(Q[lVar1],*QRdata);
      R[m * mMax + lVar1] = sVar2;
      N_VLinearSum(1.0,*QRdata,-sVar2,Q[lVar1],*QRdata);
      lVar1 = lVar1 + 1;
    } while (m != lVar1);
  }
  sVar2 = N_VDotProd(*QRdata,*QRdata);
  dVar3 = 0.0;
  if (0.0 < sVar2) {
    if (sVar2 < 0.0) {
      dVar3 = sqrt(sVar2);
    }
    else {
      dVar3 = SQRT(sVar2);
    }
  }
  R[m * (mMax + 1)] = dVar3;
  N_VScale(1.0 / dVar3,*QRdata,Q[m]);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_MGS(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                        int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);

  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr();
  for (j = 0; j < m; j++)
  {
    R[m * mMax + j] = N_VDotProd(Q[j], qrdata->vtemp);
    SUNCheckLastErr();
    N_VLinearSum(ONE, qrdata->vtemp, -R[m * mMax + j], Q[j], qrdata->vtemp);
    SUNCheckLastErr();
  }
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}